

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argon2_core.c
# Opt level: O2

int rxa2_fill_memory_blocks(argon2_instance_t *instance)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong unaff_R15;
  argon2_position_t position;
  
  iVar1 = -0x19;
  if ((instance != (argon2_instance_t *)0x0) && (uVar2 = instance->lanes, iVar1 = -0x19, uVar2 != 0)
     ) {
    for (uVar6 = 0; uVar6 < instance->passes; uVar6 = uVar6 + 1) {
      for (uVar3 = 0; uVar3 != 4; uVar3 = uVar3 + 1) {
        uVar5 = uVar6;
        for (uVar4 = 0; uVar4 < uVar2; uVar4 = uVar4 + 1) {
          unaff_R15 = (uint)unaff_R15 & 0xffffff00 | uVar3;
          position.slice = (char)unaff_R15;
          position._9_3_ = (int3)(unaff_R15 >> 8);
          position.index = (int)(unaff_R15 >> 0x20);
          position.pass = (int)uVar5;
          position.lane = (int)(uVar5 >> 0x20);
          rxa2_fill_segment(instance,position);
          uVar2 = instance->lanes;
          uVar5 = uVar5 + 0x100000000;
        }
      }
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int rxa2_fill_memory_blocks(argon2_instance_t *instance) {
	if (instance == NULL || instance->lanes == 0) {
		return ARGON2_INCORRECT_PARAMETER;
	}
	return fill_memory_blocks_st(instance);
}